

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::FindMatchingNamedSpectrum_abi_cxx11_
          (string *__return_storage_ptr__,pbrt *this,SpectrumHandle *s)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  bool bVar3;
  Float FVar4;
  Float FVar5;
  SpectrumHandle local_40;
  SpectrumHandle local_38;
  
  if (Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_._24_8_ != 0x30d1aa8) {
    p_Var1 = (_Rb_tree_node_base *)Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_._24_8_;
    do {
      local_38.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                *)this;
      local_40.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                *)(p_Var1 + 2);
      lVar2 = 0;
      do {
        FVar5 = *(Float *)((long)&DAT_004b9620 + lVar2);
        FVar4 = SpectrumHandle::operator()(&local_38,FVar5);
        FVar5 = SpectrumHandle::operator()(&local_40,FVar5);
        if ((FVar4 != FVar5) || (NAN(FVar4) || NAN(FVar5))) break;
        bVar3 = lVar2 != 0x34;
        lVar2 = lVar2 + 4;
      } while (bVar3);
      if ((FVar4 == FVar5) && (!NAN(FVar4) && !NAN(FVar5))) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*(long *)(p_Var1 + 1),
                   (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
        return __return_storage_ptr__;
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)
                       (Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_ + 8));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string FindMatchingNamedSpectrum(SpectrumHandle s) {
    auto sampledLambdasMatch = [](SpectrumHandle a, SpectrumHandle b) {
        const Float wls[] = {306, 360.932007, 380, 402, 455, 503, 579,
                             610, 660,        692, 702, 760, 800, 860};
        for (Float lambda : wls)
            if (a(lambda) != b(lambda))
                return false;
        return true;
    };
    for (const auto &spd : Spectra::namedSpectra) {
        if (sampledLambdasMatch(s, spd.second))
            return spd.first;
    }
    return "";
}